

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O0

SUNAdaptController SUNAdaptController_PID(SUNContext_conflict sunctx)

{
  SUNAdaptController k3;
  sunrealtype in_RDI;
  SUNAdaptController C;
  SUNContext_conflict sunctx_local_scope_;
  sunrealtype k1;
  
  k1 = in_RDI;
  k3 = SUNAdaptController_Soderlind((SUNContext_conflict)C);
  SUNAdaptController_SetParams_PID(C,k1,in_RDI,(sunrealtype)k3);
  return k3;
}

Assistant:

SUNAdaptController SUNAdaptController_PID(SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);

  SUNAdaptController C = SUNAdaptController_Soderlind(sunctx);
  SUNCheckLastErrNull();

  SUNCheckCallNull(SUNAdaptController_SetParams_PID(C, DEFAULT_PID_K1,
                                                    DEFAULT_PID_K2,
                                                    DEFAULT_PID_K3));

  return (C);
}